

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TableGetColumnIsSorted(int column_n)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  bool local_1;
  
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    local_1 = false;
  }
  else {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)GImGui,
                        (int)((ulong)GImGui->CurrentTable >> 0x20));
    local_1 = pIVar1->SortOrder != -1;
  }
  return local_1;
}

Assistant:

bool ImGui::TableGetColumnIsSorted(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];
    return (column->SortOrder != -1);
}